

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O3

void P_RecalculateLights(sector_t *sector)

{
  extsector_t *peVar1;
  lightlist_t *plVar2;
  F3DFloor *this;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  peVar1 = sector->e;
  if ((peVar1->XFloor).lightlist.Count != 0) {
    lVar6 = 0x30;
    uVar5 = 0;
    do {
      plVar2 = (peVar1->XFloor).lightlist.Array;
      this = *(F3DFloor **)((long)&(plVar2->plane).normal.Z + lVar6);
      if (this == (F3DFloor *)0x0) {
        *(FDynamicColormap **)((long)&(plVar2->plane).normal.X + lVar6) = sector->ColorMap;
        *(undefined4 *)((long)&(plVar2->plane).normal.Y + lVar6) = 0;
      }
      else {
        F3DFloor::UpdateColormap
                  (this,(FDynamicColormap **)((long)&(plVar2->plane).normal.X + lVar6));
        lVar3 = *(long *)((long)&(plVar2->plane).normal.Z + lVar6);
        if (((*(byte *)(lVar3 + 0x5b) & 8) != 0) ||
           (iVar4 = *(int *)(*(long *)(*(long *)(lVar3 + 0x68) + 0x100) + 0xc),
           *(int *)(*(long *)(*(long *)(lVar3 + 0x70) + 0x100) + 0xc) == iVar4)) {
          iVar4 = 0;
        }
        *(int *)((long)&(plVar2->plane).normal.Y + lVar6) = iVar4;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x50;
    } while (uVar5 < (peVar1->XFloor).lightlist.Count);
  }
  return;
}

Assistant:

void P_RecalculateLights(sector_t *sector)
{
	TArray<lightlist_t> &lightlist = sector->e->XFloor.lightlist;

	for(unsigned i = 0; i < lightlist.Size(); i++)
	{
		lightlist_t *ll = &lightlist[i];
		if (ll->lightsource != NULL)
		{
			ll->lightsource->UpdateColormap(ll->extra_colormap);
			ll->blend = ll->lightsource->GetBlend();
		}
		else
		{
			ll->extra_colormap = sector->ColorMap;
			ll->blend = 0;
		}
	}
}